

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall kws::Parser::Check(Parser *this,char *name,char *value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_long posPrivate;
  long lVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  ostream *poVar7;
  bool alignment;
  bool bVar8;
  string val;
  string v1;
  string v2;
  string v3;
  string v4;
  string v5;
  string v6;
  allocator local_50 [32];
  
  iVar1 = strcmp(name,"LineLength");
  if (iVar1 == 0) {
    std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
    uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
    CheckLineLength(this,uVar6,false,true);
    goto LAB_0011b1e3;
  }
  if ((this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    CheckLineLength(this,0,false,false);
  }
  iVar1 = strcmp(name,"DeclarationOrder");
  if (iVar1 == 0) {
    std::__cxx11::string::string((string *)&val,value,(allocator *)&v3);
    uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
    std::__cxx11::string::string((string *)&v1,value + 2,(allocator *)&v4);
    uVar5 = std::__cxx11::stoul(&v1,(size_t *)0x0,10);
    std::__cxx11::string::string((string *)&v2,value + 4,(allocator *)&v5);
    posPrivate = std::__cxx11::stoul(&v2,(size_t *)0x0,10);
    CheckDeclarationOrder(this,uVar6,uVar5,posPrivate);
  }
  else {
    iVar1 = strcmp(name,"Typedefs");
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
      lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
      if (lVar4 == -1) {
        bVar8 = true;
      }
      else {
        std::__cxx11::string::substr((ulong)&v1,(ulong)&val);
        lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
        std::__cxx11::string::string((string *)&v2,"",(allocator *)&v3);
        if (lVar4 == -1) {
          std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        }
        else {
          std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        }
        std::__cxx11::string::operator=((string *)&v2,(string *)&v3);
        std::__cxx11::string::~string((string *)&v3);
        iVar1 = strcmp(v2._M_dataplus._M_p,"false");
        if ((iVar1 == 0) ||
           ((bVar8 = true, *v2._M_dataplus._M_p == '0' && (v2._M_dataplus._M_p[1] == '\0')))) {
          bVar8 = false;
        }
        std::__cxx11::string::_M_assign((string *)&val);
        std::__cxx11::string::~string((string *)&v2);
        std::__cxx11::string::~string((string *)&v1);
      }
      CheckTypedefs(this,val._M_dataplus._M_p,bVar8,0x51);
      goto LAB_0011b1e3;
    }
    iVar1 = strcmp(name,"InternalVariables");
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
      bVar8 = false;
      lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
      if (lVar4 == -1) {
        alignment = true;
      }
      else {
        std::__cxx11::string::substr((ulong)&v1,(ulong)&val);
        lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
        std::__cxx11::string::string((string *)&v2,"",(allocator *)&v3);
        if (lVar4 == -1) {
          std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        }
        else {
          std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        }
        std::__cxx11::string::operator=((string *)&v2,(string *)&v3);
        std::__cxx11::string::~string((string *)&v3);
        iVar1 = strcmp(v2._M_dataplus._M_p,"false");
        if ((iVar1 == 0) ||
           ((alignment = true, *v2._M_dataplus._M_p == '0' && (v2._M_dataplus._M_p[1] == '\0')))) {
          alignment = false;
        }
        if (lVar4 == -1) {
          bVar8 = false;
        }
        else {
          lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
          std::__cxx11::string::string((string *)&v3,"",(allocator *)&v4);
          if (lVar4 == -1) {
            std::__cxx11::string::substr((ulong)&v4,(ulong)&val);
          }
          else {
            std::__cxx11::string::substr((ulong)&v4,(ulong)&val);
          }
          std::__cxx11::string::operator=((string *)&v3,(string *)&v4);
          std::__cxx11::string::~string((string *)&v4);
          iVar1 = strcmp(v3._M_dataplus._M_p,"true");
          if ((iVar1 == 0) || ((*v3._M_dataplus._M_p == '1' && (v3._M_dataplus._M_p[1] == '\0')))) {
            bVar8 = true;
          }
          else {
            bVar8 = false;
          }
          std::__cxx11::string::~string((string *)&v3);
        }
        std::__cxx11::string::_M_assign((string *)&val);
        std::__cxx11::string::~string((string *)&v2);
        std::__cxx11::string::~string((string *)&v1);
      }
      CheckInternalVariables(this,val._M_dataplus._M_p,alignment,bVar8);
      goto LAB_0011b1e3;
    }
    iVar1 = strcmp(name,"Variables");
    if (iVar1 == 0) {
      CheckVariables(this,value);
      return true;
    }
    iVar1 = strcmp(name,"Struct");
    if (iVar1 == 0) {
      CheckStruct(this,value,true);
      return true;
    }
    iVar1 = strcmp(name,"MemberFunctions");
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
      std::__cxx11::string::string((string *)&v1,value,(allocator *)&v2);
      std::__cxx11::string::string((string *)&v2,"0",(allocator *)&v3);
      lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        std::__cxx11::string::operator=((string *)&v1,(string *)&v3);
        std::__cxx11::string::~string((string *)&v3);
        std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        std::__cxx11::string::operator=((string *)&v2,(string *)&v3);
        std::__cxx11::string::~string((string *)&v3);
      }
      std::__cxx11::string::string((string *)&v3,v2._M_dataplus._M_p,(allocator *)&v4);
      uVar6 = std::__cxx11::stoul(&v3,(size_t *)0x0,10);
      CheckMemberFunctions(this,v1._M_dataplus._M_p,uVar6);
    }
    else {
      iVar1 = strcmp(name,"Functions");
      if (iVar1 != 0) {
        iVar1 = strcmp(name,"SemicolonSpace");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
          uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
          CheckSemicolonSpace(this,uVar6);
          goto LAB_0011b1e3;
        }
        iVar1 = strcmp(name,"EndOfFileNewLine");
        if (iVar1 == 0) {
          CheckEndOfFileNewLine(this);
          return true;
        }
        iVar1 = strcmp(name,"Tabs");
        if (iVar1 == 0) {
          CheckTabs(this);
          return true;
        }
        iVar1 = strcmp(name,"Spaces");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
          uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
          CheckExtraSpaces(this,uVar6,false);
          goto LAB_0011b1e3;
        }
        iVar1 = strcmp(name,"StatementPerLine");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
          std::__cxx11::string::string((string *)&v1,value,(allocator *)&v2);
          lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
          if (lVar4 == -1) {
            bVar8 = true;
          }
          else {
            std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
            std::__cxx11::string::operator=((string *)&v1,(string *)&v2);
            std::__cxx11::string::~string((string *)&v2);
            std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
            bVar8 = std::operator==(&v2,"0");
            bVar8 = !bVar8;
            std::__cxx11::string::~string((string *)&v2);
          }
          std::__cxx11::string::string((string *)&v2,v1._M_dataplus._M_p,(allocator *)&v3);
          uVar6 = std::__cxx11::stoul(&v2,(size_t *)0x0,10);
          CheckStatementPerLine(this,uVar6,bVar8);
          goto LAB_0011ac49;
        }
        iVar1 = strcmp(name,"BadCharacters");
        if (iVar1 == 0) {
          iVar1 = strcmp(value,"true");
          CheckBadCharacters(this,iVar1 == 0);
          return true;
        }
        iVar1 = strcmp(name,"VariablePerLine");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
          uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
          CheckVariablePerLine(this,uVar6);
          goto LAB_0011b1e3;
        }
        iVar1 = strcmp(name,"Comments");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
          lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
          if (lVar4 == -1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Comments not defined correctly");
            std::endl<char,std::char_traits<char>>(poVar7);
            bVar8 = false;
          }
          else {
            std::__cxx11::string::substr((ulong)&v1,(ulong)&val);
            lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
            if (lVar4 == -1) {
              poVar7 = std::operator<<((ostream *)&std::cout,"Comments not defined correctly");
              std::endl<char,std::char_traits<char>>(poVar7);
              bVar8 = false;
            }
            else {
              std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
              lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
              bVar8 = lVar4 != -1;
              if (lVar4 == -1) {
                poVar7 = std::operator<<((ostream *)&std::cout,"Comments not defined correctly");
                std::endl<char,std::char_traits<char>>(poVar7);
              }
              else {
                std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
                lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
                std::__cxx11::string::string((string *)&v4,"",(allocator *)&v5);
                if (lVar4 == -1) {
                  std::__cxx11::string::substr((ulong)&v5,(ulong)&val);
                }
                else {
                  std::__cxx11::string::substr((ulong)&v5,(ulong)&val);
                }
                std::__cxx11::string::operator=((string *)&v4,(string *)&v5);
                std::__cxx11::string::~string((string *)&v5);
                iVar1 = strcmp(v4._M_dataplus._M_p,"true");
                lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
                std::__cxx11::string::string((string *)&v5,"",(allocator *)&v6);
                if (lVar4 == -1) {
                  std::__cxx11::string::substr((ulong)&v6,(ulong)&val);
                }
                else {
                  std::__cxx11::string::substr((ulong)&v6,(ulong)&val);
                }
                std::__cxx11::string::operator=((string *)&v5,(string *)&v6);
                std::__cxx11::string::~string((string *)&v6);
                iVar2 = strcmp(v5._M_dataplus._M_p,"false");
                std::__cxx11::string::find((char *)&val,0x155075);
                std::__cxx11::string::string((string *)&v6,"",local_50);
                if (lVar4 == -1) {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)&val);
                }
                else {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)&val);
                }
                std::__cxx11::string::operator=((string *)&v6,(string *)local_50);
                std::__cxx11::string::~string((string *)local_50);
                iVar3 = strcmp(v6._M_dataplus._M_p,"false");
                CheckComments(this,v1._M_dataplus._M_p,v2._M_dataplus._M_p,v3._M_dataplus._M_p,
                              iVar1 == 0,iVar2 != 0,iVar3 != 0);
                std::__cxx11::string::~string((string *)&v6);
                std::__cxx11::string::~string((string *)&v5);
                std::__cxx11::string::~string((string *)&v4);
                std::__cxx11::string::~string((string *)&v3);
              }
              std::__cxx11::string::~string((string *)&v2);
            }
            std::__cxx11::string::~string((string *)&v1);
          }
          std::__cxx11::string::~string((string *)&val);
          return bVar8;
        }
        iVar1 = strcmp(name,"Header");
        if (iVar1 == 0) {
          std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
          lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
          if (lVar4 == -1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Header not defined correctly");
            std::endl<char,std::char_traits<char>>(poVar7);
            goto LAB_0011be1e;
          }
          std::__cxx11::string::string((string *)&v1,"",(allocator *)&v2);
          if (lVar4 != 0) {
            std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
            std::__cxx11::string::operator=((string *)&v1,(string *)&v2);
            std::__cxx11::string::~string((string *)&v2);
          }
          lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
          if (lVar4 == -1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Header not defined correctly");
            std::endl<char,std::char_traits<char>>(poVar7);
            goto LAB_0011be14;
          }
          std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
          std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
          if (v1._M_string_length != 0) {
            iVar1 = strcmp(v3._M_dataplus._M_p,"true");
            iVar2 = strcmp(v2._M_dataplus._M_p,"true");
            CheckHeader(this,v1._M_dataplus._M_p,iVar2 == 0,iVar1 == 0);
          }
LAB_0011b7ad:
          std::__cxx11::string::~string((string *)&v3);
LAB_0011be0a:
          std::__cxx11::string::~string((string *)&v2);
        }
        else {
          iVar1 = strcmp(name,"Indent");
          if (iVar1 == 0) {
            std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
            lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
            if (lVar4 == -1) {
              poVar7 = std::operator<<((ostream *)&std::cout,"Indent not defined correctly");
              std::endl<char,std::char_traits<char>>(poVar7);
              goto LAB_0011be1e;
            }
            std::__cxx11::string::substr((ulong)&v1,(ulong)&val);
            lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
            if (lVar4 == -1) {
              poVar7 = std::operator<<((ostream *)&std::cout,"Indent not defined correctly");
              std::endl<char,std::char_traits<char>>(poVar7);
              goto LAB_0011be14;
            }
            std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
            lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
            if (lVar4 != -1) {
              std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
              std::__cxx11::string::substr((ulong)&v4,(ulong)&val);
              iVar1 = strcmp(v3._M_dataplus._M_p,"true");
              iVar2 = strcmp(v4._M_dataplus._M_p,"true");
              iVar3 = strcmp(v1._M_dataplus._M_p,"TAB");
              std::__cxx11::string::string((string *)&v5,v2._M_dataplus._M_p,(allocator *)&v6);
              uVar6 = std::__cxx11::stoul(&v5,(size_t *)0x0,10);
              CheckIndent(this,(uint)(iVar3 == 0),uVar6,iVar1 == 0,iVar2 == 0,0x51,true);
              std::__cxx11::string::~string((string *)&v5);
              std::__cxx11::string::~string((string *)&v4);
              goto LAB_0011b7ad;
            }
            poVar7 = std::operator<<((ostream *)&std::cout,"Indent not defined correctly");
            std::endl<char,std::char_traits<char>>(poVar7);
            goto LAB_0011be0a;
          }
          iVar1 = strcmp(name,"Namespace");
          if (iVar1 == 0) {
            CheckNamespace(this,value,true);
            return false;
          }
          iVar1 = strcmp(name,"NameOfClass");
          if (iVar1 == 0) {
            std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
            lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
            if (lVar4 == -1) {
              poVar7 = std::operator<<((ostream *)&std::cout,"NameOfClass not defined correctly");
              std::endl<char,std::char_traits<char>>(poVar7);
              goto LAB_0011be1e;
            }
            std::__cxx11::string::substr((ulong)&v1,(ulong)&val);
            std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
            CheckNameOfClass(this,v1._M_dataplus._M_p,v2._M_dataplus._M_p);
            goto LAB_0011be0a;
          }
          iVar1 = strcmp(name,"IfNDefDefine");
          if (iVar1 != 0) {
            iVar1 = strcmp(name,"EmptyLines");
            if (iVar1 == 0) {
              std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
              uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
              CheckEmptyLines(this,uVar6,false);
              goto LAB_0011be1e;
            }
            iVar1 = strcmp(name,"Template");
            if (iVar1 == 0) {
              CheckTemplate(this,value);
              return false;
            }
            iVar1 = strcmp(name,"Operator");
            if (iVar1 == 0) {
              std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
              lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
              if (lVar4 == -1) {
                poVar7 = std::operator<<((ostream *)&std::cout,"Operator not defined correctly");
                std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_0011be1e;
              }
              std::__cxx11::string::substr((ulong)&v1,(ulong)&val);
              std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
              uVar6 = std::__cxx11::stoul(&v1,(size_t *)0x0,10);
              uVar5 = std::__cxx11::stoul(&v2,(size_t *)0x0,10);
              CheckOperator(this,(uint)uVar6,(uint)uVar5,0x51,true);
            }
            else {
              iVar1 = strcmp(name,"Comma");
              if (iVar1 != 0) {
                iVar1 = strcmp(name,"Parenthesis");
                if (iVar1 != 0) {
                  iVar1 = strcmp(name,"IfWhileForUntil");
                  if (iVar1 == 0) {
                    std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
                    uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
                    CheckIfWhileForUntil(this,(uint)uVar6);
                    goto LAB_0011be1e;
                  }
                  iVar1 = strcmp(name,"BlackList");
                  if (iVar1 == 0) {
                    CheckBlackList(this,value);
                    return false;
                  }
                  iVar1 = strcmp(name,"UsingDirectives");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(name,"RelativePathInInclude");
                    if (iVar1 != 0) {
                      return false;
                    }
                    if ((*value != '0') || (value[1] != '\0')) {
                      iVar1 = strcmp(value,"false");
                      bVar8 = true;
                      if (iVar1 != 0) goto LAB_0011ab7e;
                    }
                    bVar8 = false;
LAB_0011ab7e:
                    CheckRelativePathInInclude(this,bVar8);
                    return false;
                  }
                  if ((*value != '0') || (value[1] != '\0')) {
                    iVar1 = strcmp(value,"false");
                    bVar8 = true;
                    if (iVar1 != 0) goto LAB_0011befd;
                  }
                  bVar8 = false;
LAB_0011befd:
                  CheckUsingDirectives(this,bVar8);
                  return false;
                }
                std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
                uVar6 = std::__cxx11::stoul(&val,(size_t *)0x0,10);
                CheckParenthesis(this,(uint)uVar6);
                goto LAB_0011be1e;
              }
              std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
              lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
              if (lVar4 == -1) {
                poVar7 = std::operator<<((ostream *)&std::cout,"Comma not defined correctly");
                std::endl<char,std::char_traits<char>>(poVar7);
                goto LAB_0011be1e;
              }
              std::__cxx11::string::substr((ulong)&v1,(ulong)&val);
              std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
              uVar6 = std::__cxx11::stoul(&v1,(size_t *)0x0,10);
              uVar5 = std::__cxx11::stoul(&v2,(size_t *)0x0,10);
              CheckComma(this,(uint)uVar6,(uint)uVar5);
            }
            goto LAB_0011be0a;
          }
          std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
          std::__cxx11::string::string((string *)&v1,value,(allocator *)&v2);
          bVar8 = false;
          lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
          if (lVar4 != -1) {
            std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
            std::__cxx11::string::operator=((string *)&v1,(string *)&v2);
            std::__cxx11::string::~string((string *)&v2);
            std::__cxx11::string::substr((ulong)&v2,(ulong)&val);
            iVar1 = std::__cxx11::string::compare((char *)&v2);
            if (iVar1 == 0) {
              bVar8 = true;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)&v2);
              bVar8 = iVar1 == 0;
            }
            std::__cxx11::string::~string((string *)&v2);
          }
          CheckIfNDefDefine(this,v1._M_dataplus._M_p,bVar8);
        }
LAB_0011be14:
        std::__cxx11::string::~string((string *)&v1);
LAB_0011be1e:
        std::__cxx11::string::~string((string *)&val);
        return false;
      }
      std::__cxx11::string::string((string *)&val,value,(allocator *)&v1);
      std::__cxx11::string::string((string *)&v1,value,(allocator *)&v2);
      std::__cxx11::string::string((string *)&v2,"0",(allocator *)&v3);
      lVar4 = std::__cxx11::string::find((char *)&val,0x155075);
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        std::__cxx11::string::operator=((string *)&v1,(string *)&v3);
        std::__cxx11::string::~string((string *)&v3);
        std::__cxx11::string::substr((ulong)&v3,(ulong)&val);
        std::__cxx11::string::operator=((string *)&v2,(string *)&v3);
        std::__cxx11::string::~string((string *)&v3);
      }
      std::__cxx11::string::string((string *)&v3,v2._M_dataplus._M_p,(allocator *)&v4);
      uVar6 = std::__cxx11::stoul(&v3,(size_t *)0x0,10);
      CheckFunctions(this,v1._M_dataplus._M_p,uVar6);
    }
    std::__cxx11::string::~string((string *)&v3);
  }
LAB_0011ac49:
  std::__cxx11::string::~string((string *)&v2);
  std::__cxx11::string::~string((string *)&v1);
LAB_0011b1e3:
  std::__cxx11::string::~string((string *)&val);
  return true;
}

Assistant:

bool Parser::Check(const char* name, const char* value)
{
  if(!strcmp(name,"LineLength"))
    {
    this->CheckLineLength(std::stoul(value));
    return true;
    }
  else if(m_Positions.empty())
    {
    this->CheckLineLength(0,false,false); // run CheckLineLength without errors to fill m_Positions
    }
  if(!strcmp(name,"DeclarationOrder"))
    {
    this->CheckDeclarationOrder(std::stoul(&value[0]),std::stoul(&value[2]),std::stoul(&value[4]));
    return true;
    }
  if(!strcmp(name,"Typedefs"))
    {
    bool alignment = true; // check alignment by default
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      std::string v1 = val.substr(0,pos);

      // Check the alignment
      size_t pos1 = val.find(",",pos+1);

      std::string v2 = "";
      if(pos1 == std::string::npos)
        {
        v2 = val.substr(pos+1,val.size()-pos-1);
        }
      else
        {
        v2 = val.substr(pos+1,pos1-pos-1);
        }

      if(!strcmp(v2.c_str(),"false") || !strcmp(v2.c_str(),"0"))
        {
        alignment = false;
        }
      val = v1;
      }

    this->CheckTypedefs(val.c_str(),alignment);
    return true;
    }
  if(!strcmp(name,"InternalVariables"))
    {
    bool alignment = true; // check alignment by default
    bool checkProtected = false; // check protected by default
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      std::string v1 = val.substr(0,pos);

      // Check the alignment
      size_t pos1 = val.find(",",pos+1);

      std::string v2 = "";
      if(pos1 == std::string::npos)
        {
        v2 = val.substr(pos+1,val.size()-pos-1);
        }
      else
        {
        v2 = val.substr(pos+1,pos1-pos-1);
        }

      if(!strcmp(v2.c_str(),"false") || !strcmp(v2.c_str(),"0"))
        {
        alignment = false;
        }

      if(pos1 != std::string::npos)
        {
        // Check the protected
        pos = val.find(",",pos1+1);
        std::string v3 = "";
        if(pos == std::string::npos)
          {
          v3 = val.substr(pos1+1,val.size()-pos1-1);
          }
        else
          {
          v3 = val.substr(pos1+1,pos-pos1-1);
          }

        if(!strcmp(v3.c_str(),"true") || !strcmp(v3.c_str(),"1"))
          {
          checkProtected = true;
          }
        }
      val = v1;
      }

    this->CheckInternalVariables(val.c_str(),alignment,checkProtected);

    return true;
    }
  if(!strcmp(name,"Variables"))
    {
    this->CheckVariables(value);
    return true;
    }
  if(!strcmp(name,"Struct"))
    {
    this->CheckStruct(value);
    return true;
    }
  if(!strcmp(name,"MemberFunctions"))
    {
    std::string val = value;
    std::string v1 = value;
    std::string v2 = "0";
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      v2 = val.substr(pos+1,val.size()-pos-1);
      }
    this->CheckMemberFunctions(v1.c_str(),std::stoul(v2.c_str()));
    return true;
    }
  if(!strcmp(name,"Functions"))
    {
    std::string val = value;
    std::string v1 = value;
    std::string v2 = "0";
    size_t pos = val.find(",",0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      v2 = val.substr(pos+1,val.size()-pos-1);
      }
    this->CheckFunctions(v1.c_str(),std::stoul(v2.c_str()));
    return true;
    }
  if(!strcmp(name,"SemicolonSpace"))
    {
    this->CheckSemicolonSpace(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"EndOfFileNewLine"))
    {
    this->CheckEndOfFileNewLine();
    return true;
    }
  if(!strcmp(name,"Tabs"))
    {
    this->CheckTabs();
    return true;
    }
  if(!strcmp(name,"Spaces"))
    {
    this->CheckExtraSpaces(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"StatementPerLine"))
    {
    std::string val = value;
    std::string v1 = value;
    size_t pos = val.find(",",0);
    bool checkInlineFunctions = true;
    if(pos != std::string::npos)
      {
      v1 = val.substr(0,pos);
      std::string v2 = val.substr(pos+1,val.size()-pos-1);
      if(v2 == "0")
        {
        checkInlineFunctions = false;
        }
      }

    this->CheckStatementPerLine(std::stoul(v1.c_str()),checkInlineFunctions);
    return true;
    }
 if(!strcmp(name,"BadCharacters"))
    {
    this->CheckBadCharacters(!strcmp(value,"true"));
    return true;
    }
  if(!strcmp(name,"VariablePerLine"))
    {
    this->CheckVariablePerLine(std::stoul(value));
    return true;
    }
  if(!strcmp(name,"Comments"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    auto pos1 = val.find(",", pos + 1);
    if(pos1 == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v2 = val.substr(pos+1,pos1-pos-1);
    pos = val.find(",",pos1+1);
    if(pos == std::string::npos)
      {
      std::cout << "Comments not defined correctly" << std::endl;
      return false;
      }
    std::string v3 = val.substr(pos1+1,pos-pos1-1);

    // Check if we allow empty lines before /class
    pos1 = val.find(",",pos+1);
    std::string v4 = "";
    if(pos1 == std::string::npos)
      {
      v4 = val.substr(pos+1,val.length()-pos-1);
      }
    else
      {
      v4 = val.substr(pos+1,pos1-pos-1);
      }

    bool allowEmptyLine = !strcmp(v4.c_str(),"true");

    // Check if we should check the comments misspeling
    pos = val.find(",",pos1+1);
    std::string v5 = "";
    if(pos == std::string::npos)
      {
      v5 = val.substr(pos1+1,val.length()-pos1-1);
      }
    else
      {
      v5 = val.substr(pos1+1,pos-pos1-1);
      }

    bool checkWrongComment = true;
    if(!strcmp(v5.c_str(),"false"))
      {
      checkWrongComment = false;
      }

    // Check if we should check the missing comments
    pos1 = val.find(",",pos+1);
    std::string v6 = "";
    if(pos == std::string::npos)
      {
      v6 = val.substr(pos+1,val.length()-pos-1);
      }
    else
      {
      v6 = val.substr(pos+1,pos1-pos-1);
      }

    bool checkMissingComment = true;
    if(!strcmp(v6.c_str(),"false"))
      {
      checkMissingComment = false;
      }

    this->CheckComments(v1.c_str(),v2.c_str(),v3.c_str(),allowEmptyLine,checkWrongComment,checkMissingComment);

    return true;
    }
  // should be before CheckIndent
  else if(!strcmp(name,"Header"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Header not defined correctly" << std::endl;
      return false;
      }

    std::string v1 = "";
    if(pos>0)
      {
      v1 = val.substr(0,pos);
      }

      auto pos1 = val.find(",", pos + 1);
      if (pos1 == std::string::npos) {
        std::cout << "Header not defined correctly" << std::endl;
        return false;
      }

    std::string v2 = val.substr(pos+1,pos1-pos-1);
    std::string v3 = val.substr(pos1+1,val.length()-pos1-1);

    bool spaceEndOfLine = false;
    bool useCVS = false;

    if(!strcmp(v2.c_str(),"true"))
      {
      spaceEndOfLine = true;
      }
    if(!strcmp(v3.c_str(),"true"))
      {
      useCVS = true;
      }

      if (!v1.empty()) {
        this->CheckHeader(v1.c_str(), spaceEndOfLine, useCVS);
      }
    }

   else if(!strcmp(name,"Indent"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    auto pos1 = val.find(",", pos + 1);
    if(pos1 == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v2 = val.substr(pos+1,pos1-pos-1);
    pos = val.find(",",pos1+1);
    if(pos == std::string::npos)
      {
      std::cout << "Indent not defined correctly" << std::endl;
      return false;
      }
    std::string v3 = val.substr(pos1+1,pos-pos1-1);
    std::string v4 = val.substr(pos+1,val.length()-pos-1);
    bool header = false;
    if(!strcmp(v3.c_str(),"true"))
      {
      header = true;
      }
    bool blockline = false;
    if(!strcmp(v4.c_str(),"true"))
      {
      blockline = true;
      }

    IndentType itype = kws::SPACE;

    if(!strcmp(v1.c_str(),"TAB"))
      {
      itype = kws::TAB;
      }
    this->CheckIndent(itype,std::stoul(v2.c_str()),header,blockline);
    }

  else if(!strcmp(name,"Namespace"))
    {
    this->CheckNamespace(value);
    }
  else if(!strcmp(name,"NameOfClass"))
    {
    std::string val = value;
    size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "NameOfClass not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckNameOfClass(v1.c_str(),v2.c_str());
    }
  else if(!strcmp(name,"IfNDefDefine"))
    {
    std::string val = value;
    std::string v1 = value;
    bool uppercaseTheDefinition = false;
    const size_t pos = val.find(",", 0);
    if(pos != std::string::npos)
      {
      v1 = val.substr(0, pos);
      std::string v2 = val.substr(pos+1);
      uppercaseTheDefinition = !v2.compare("true") || !v2.compare("1");
      }
    this->CheckIfNDefDefine(v1.c_str(), uppercaseTheDefinition);
    }
  else if(!strcmp(name,"EmptyLines"))
    {
    this->CheckEmptyLines(std::stoul(value));
    }
  else if(!strcmp(name,"Template"))
    {
    this->CheckTemplate(value);
    }
  else if(!strcmp(name,"Operator"))
    {
    std::string val = value;
    const size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Operator not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckOperator(std::stoul(v1),std::stoul(v2));
    }
  else if(!strcmp(name,"Comma"))
    {
    std::string val = value;
    const size_t pos = val.find(",",0);
    if(pos == std::string::npos)
      {
      std::cout << "Comma not defined correctly" << std::endl;
      return false;
      }
    std::string v1 = val.substr(0,pos);
    std::string v2 = val.substr(pos+1,val.length()-pos-1);
    this->CheckComma(std::stoul(v1),std::stoul(v2));
    }
  else if(!strcmp(name,"Parenthesis"))
    {
    this->CheckParenthesis(std::stoul(value));
    }
  else if(!strcmp(name,"IfWhileForUntil"))
    {
    this->CheckIfWhileForUntil(std::stoul(value));
    }
  else if(!strcmp(name,"BlackList"))
    {
    this->CheckBlackList(value);
    }
  else if(!strcmp(name, "UsingDirectives"))
    {
    bool forbidUsingDirectives = true;
    if( !strcmp(value, "0") || !strcmp(value, "false"))
      forbidUsingDirectives = false;
    this->CheckUsingDirectives(forbidUsingDirectives);
    }
  else if(!strcmp(name, "RelativePathInInclude"))
    {
    bool forbidRelativePaths = true;
    if( !strcmp(value, "0") || !strcmp(value, "false"))
      forbidRelativePaths = false;
    this->CheckRelativePathInInclude(forbidRelativePaths);
    }
  return false;
}